

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::EnhancedLayouts::XFBOverrideQualifiersWithAPITest::inspectProgram
          (XFBOverrideQualifiersWithAPITest *this,GLuint test_case_index,Program *program,
          stringstream *out_stream)

{
  GLuint GVar1;
  ostream *poVar2;
  bool bVar3;
  Type TVar4;
  TYPES TStack_60;
  GLuint type_size;
  GLuint local_58;
  Type local_4c;
  Type *local_40;
  Type *type;
  stringstream *psStack_30;
  GLint stride;
  stringstream *out_stream_local;
  Program *program_local;
  XFBOverrideQualifiersWithAPITest *pXStack_18;
  GLuint test_case_index_local;
  XFBOverrideQualifiersWithAPITest *this_local;
  
  type._4_4_ = 0;
  psStack_30 = out_stream;
  out_stream_local = (stringstream *)program;
  program_local._4_4_ = test_case_index;
  pXStack_18 = this;
  TVar4 = TestBase::getType((TestBase *)this,test_case_index);
  _TStack_60 = TVar4._0_8_;
  local_4c.m_basic_type = TStack_60;
  local_4c.m_n_columns = type_size;
  local_58 = TVar4.m_n_rows;
  local_4c.m_n_rows = local_58;
  local_40 = &local_4c;
  GVar1 = Utils::Type::GetSize(local_40);
  Utils::Program::GetResource
            ((Program *)out_stream_local,0x8c8e,0,0x934c,1,(GLint *)((long)&type + 4));
  bVar3 = GVar1 * 3 == type._4_4_;
  if (!bVar3) {
    poVar2 = std::operator<<((ostream *)(psStack_30 + 0x10),"Stride is: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,type._4_4_);
    poVar2 = std::operator<<(poVar2," expected: ");
    std::ostream::operator<<(poVar2,GVar1 * 3);
  }
  return bVar3;
}

Assistant:

bool XFBOverrideQualifiersWithAPITest::inspectProgram(GLuint test_case_index, Utils::Program& program,
													  std::stringstream& out_stream)
{
	GLint			   stride	= 0;
	const Utils::Type& type		 = getType(test_case_index);
	const GLuint	   type_size = type.GetSize();

	program.GetResource(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, GL_TRANSFORM_FEEDBACK_BUFFER_STRIDE,
						1 /* buf_size */, &stride);

	if ((GLint)(3 * type_size) != stride)
	{
		out_stream << "Stride is: " << stride << " expected: " << (3 * type_size);

		return false;
	}

	return true;
}